

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,void *value)

{
  iterator iVar1;
  arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler> *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe7;
  
  if (in_RDI->specs_ != (format_specs *)0x0) {
    check_pointer_type_spec<char,fmt::v6::internal::error_handler>
              (in_stack_ffffffffffffffe7,(error_handler *)in_RDI);
  }
  write_pointer((arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
                 *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
  iVar1 = out(in_RDI);
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(const void* value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }